

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_remove_element_at
          (CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  
  if (getp_remove_element_at(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_remove_element_at(unsigned_int,vm_val_t*,unsigned_int*)::desc)
    ;
    if (iVar1 != 0) {
      getp_remove_element_at::desc.min_argc_ = 1;
      getp_remove_element_at::desc.opt_argc_ = 0;
      getp_remove_element_at::desc.varargs_ = 0;
      __cxa_guard_release(&getp_remove_element_at(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_remove_element_at::desc);
  if (iVar1 == 0) {
    uVar2 = CVmBif::pop_int_val();
    if ((int)uVar2 < 0) {
      uVar2 = uVar2 + *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2) + 1;
    }
    if (((int)uVar2 < 1) ||
       (*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2) < uVar2)) {
      err_throw(0x7df);
    }
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    remove_elements_undo(this,self,(ulong)(uVar2 - 1),1);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_remove_element_at(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the deletion index; a negative index counts from the end */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    if (start_idx < 0)
        start_idx += get_element_count() + 1;

    /* make sure the index is in range */
    if (start_idx < 1 || start_idx > (int)get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* adjust to a zero-based index */
    --start_idx;

    /* the return value is 'self' */
    retval->set_obj(self);

    /* delete one element */
    remove_elements_undo(vmg_ self, start_idx, 1);


    /* handled */
    return TRUE;
}